

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles3::Stress::(anonymous_namespace)::TextureCase::genVertexSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  long lVar1;
  char *pcVar2;
  ostringstream buf;
  undefined1 local_190 [376];
  
  if (*(int *)((long)this + 0x84) == 1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,
               "#version 300 es\nin highp vec4 a_pos;\nin highp vec4 a_attr;\nout highp vec4 v_attr;\nvoid main ()\n{\n\tv_attr = a_attr;\n\tgl_Position = a_pos;\n}\n"
               ,"");
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "#version 300 es\nin highp vec4 a_pos;\nin highp vec2 a_attr;\nout mediump vec4 v_out;\n"
             ,0x53);
  if (*(int *)((long)this + 0x88) == 1) {
    lVar1 = 0x29;
    pcVar2 = "uniform highp sampler2DShadow u_sampler;\n";
LAB_01388376:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar2,lVar1);
  }
  else if (*(int *)((long)this + 0x88) == 0) {
    lVar1 = 0x23;
    pcVar2 = "uniform highp sampler2D u_sampler;\n";
    goto LAB_01388376;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"void main ()\n{\n",0xf);
  if (*(int *)((long)this + 0x88) == 0) {
    lVar1 = 0x40;
    pcVar2 = "\tv_out = vec4(textureLod(u_sampler, a_attr, 0.0).rg, 1.0, 1.0);\n";
  }
  else {
    if (*(int *)((long)this + 0x88) != 1) goto LAB_013883ca;
    lVar1 = 0x86;
    pcVar2 = 
    "\thighp float a1 = textureLod(u_sampler, vec3(a_attr, 0.0), 0.0);\n\tv_out = vec4(a1, (a1 > 1.0 || a1 < 0.0) ? (0.0) : (1.0), 1.0, 1.0);\n"
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar2,lVar1);
LAB_013883ca:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\tgl_Position = a_pos;\n}\n",0x18);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string TextureCase::genVertexSource (void) const
{
	// vertex shader is passthrough, fragment does the calculations
	if (m_type == TYPE_FRAGMENT)
		return s_attrPassthroughVertexShaderSource;

	// vertex shader does the calculations
	std::ostringstream buf;
	buf <<	"#version 300 es\n"
			"in highp vec4 a_pos;\n"
			"in highp vec2 a_attr;\n"
			"out mediump vec4 v_out;\n";

	if (m_textureType == TEXTURE_FLOAT)
		buf <<	"uniform highp sampler2D u_sampler;\n";
	else if (m_textureType == TEXTURE_DEPTH)
		buf <<	"uniform highp sampler2DShadow u_sampler;\n";
	else
		DE_ASSERT(DE_FALSE);

	buf <<	"void main ()\n"
			"{\n";

	if (m_textureType == TEXTURE_FLOAT)
		buf <<	"	v_out = vec4(textureLod(u_sampler, a_attr, 0.0).rg, 1.0, 1.0);\n";
	else if (m_textureType == TEXTURE_DEPTH)
		buf <<	"	highp float a1 = textureLod(u_sampler, vec3(a_attr, 0.0), 0.0);\n"
				"	v_out = vec4(a1, (a1 > 1.0 || a1 < 0.0) ? (0.0) : (1.0), 1.0, 1.0);\n";
	else
		DE_ASSERT(DE_FALSE);

	buf <<	"	gl_Position = a_pos;\n"
			"}\n";
	return buf.str();
}